

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

void __thiscall
dxil_spv::CFGStructurizer::rewrite_transposed_loop_inner
          (CFGStructurizer *this,CFGNode *node,CFGNode *impossible_merge_target,
          LoopMergeAnalysis *analysis)

{
  CFGNode *to;
  uint32_t uVar1;
  CFGNode *to_00;
  CFGNode *this_00;
  pointer ppCVar2;
  ThreadLocalAllocator<char> local_b9;
  CFGNode *local_b8;
  CFGStructurizer *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  Vector<CFGNode_*> ladder_preds;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_50;
  
  local_b8 = analysis->merge;
  to = analysis->dominated_merge;
  local_b0 = this;
  to_00 = CFGNodePool::create_node(this->pool);
  std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)&local_a8,&node->name,".transposed-merge-inner.break");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&to_00->name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            &local_a8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             &local_a8);
  (to_00->ir).terminator.type = Branch;
  (to_00->ir).terminator.direct_block = impossible_merge_target;
  to_00->immediate_post_dominator = impossible_merge_target;
  uVar1 = impossible_merge_target->backward_post_visit_order;
  to_00->forward_post_visit_order = impossible_merge_target->forward_post_visit_order;
  to_00->backward_post_visit_order = uVar1;
  this_00 = CFGNodePool::create_node(local_b0->pool);
  std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)&local_a8,&node->name,".transposed-merge-inner");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&this_00->name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            &local_a8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
             &local_a8);
  uVar1 = impossible_merge_target->backward_post_visit_order;
  this_00->forward_post_visit_order = impossible_merge_target->forward_post_visit_order;
  this_00->backward_post_visit_order = uVar1;
  this_00->immediate_post_dominator = local_b8;
  to_00->immediate_dominator = this_00;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&ladder_preds,&to->pred);
  CFGNode::add_branch(this_00,to_00);
  CFGNode::add_branch(this_00,to);
  local_b8 = node;
  traverse_dominated_blocks_and_rewrite_branch(local_b0,node,impossible_merge_target,this_00);
  CFGNode::recompute_immediate_dominator(this_00);
  CFGNode::add_branch(to_00,impossible_merge_target);
  for (ppCVar2 = ladder_preds.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar2 !=
      ladder_preds.
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppCVar2 = ppCVar2 + 1) {
    CFGNode::retarget_branch(*ppCVar2,to,this_00);
  }
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<bool_(const_dxil_spv::CFGNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp:5472:3)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<bool_(const_dxil_spv::CFGNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp:5472:3)>
             ::_M_manager;
  local_a8._M_unused._M_object = &ladder_preds;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&local_70,"transposed_selector_",&local_b9);
  std::operator+(&local_50,&local_70,&local_b8->name);
  rewrite_ladder_conditional_branch_from_incoming_blocks
            (local_b0,this_00,to,to_00,(function<bool_(const_dxil_spv::CFGNode_*)> *)&local_a8,
             &local_50);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose(&local_50);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose(&local_70);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  std::_Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
  ~_Vector_base(&ladder_preds.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               );
  return;
}

Assistant:

void CFGStructurizer::rewrite_transposed_loop_inner(CFGNode *node, CFGNode *impossible_merge_target,
                                                    const LoopMergeAnalysis &analysis)
{
	// Rewrite the control flow from the inside out through a transposition.
	// The common break target will become the merge block instead.
	// The continue will break out to the transposed merge instead.
	// In the ladder, we will enter a breaking path which branches out to loop_ladder.

	// We just arbitrary call this "inner", since I don't think it has a formal name.
	// In this case, dominated merge cannot reach impossible merge target.

	auto *merge = analysis.merge;
	auto *dominated_merge = analysis.dominated_merge;

	auto *ladder_break = pool.create_node();
	ladder_break->name = node->name + ".transposed-merge-inner.break";
	ladder_break->ir.terminator.type = Terminator::Type::Branch;
	ladder_break->ir.terminator.direct_block = impossible_merge_target;
	ladder_break->immediate_post_dominator = impossible_merge_target;
	ladder_break->forward_post_visit_order = impossible_merge_target->forward_post_visit_order;
	ladder_break->backward_post_visit_order = impossible_merge_target->backward_post_visit_order;

	auto *ladder_selection = pool.create_node();
	ladder_selection->name = node->name + ".transposed-merge-inner";
	ladder_selection->forward_post_visit_order = impossible_merge_target->forward_post_visit_order;
	ladder_selection->backward_post_visit_order = impossible_merge_target->backward_post_visit_order;
	ladder_selection->immediate_post_dominator = merge;
	ladder_break->immediate_dominator = ladder_selection;

	auto ladder_preds = dominated_merge->pred;

	ladder_selection->add_branch(ladder_break);
	ladder_selection->add_branch(dominated_merge);
	traverse_dominated_blocks_and_rewrite_branch(node, impossible_merge_target, ladder_selection);
	ladder_selection->recompute_immediate_dominator();

	ladder_break->add_branch(impossible_merge_target);

	// Branches from these blocks should be rewritten to target transposed-merge.
	for (auto *ladder_pred : ladder_preds)
		ladder_pred->retarget_branch(dominated_merge, ladder_selection);

	rewrite_ladder_conditional_branch_from_incoming_blocks(
		ladder_selection,
		dominated_merge, ladder_break,
		[&](const CFGNode *n) { return std::find(ladder_preds.begin(), ladder_preds.end(), n) != ladder_preds.end(); },
		String("transposed_selector_") + node->name);
}